

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Vec_Int_t * Gia_ManSaveValue(Gia_Man_t *p)

{
  int nCap;
  Vec_Int_t *p_00;
  bool bVar1;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vValues;
  Gia_Man_t *p_local;
  
  nCap = Gia_ManObjNum(p);
  p_00 = Vec_IntAlloc(nCap);
  local_24 = 0;
  while( true ) {
    bVar1 = false;
    if (local_24 < p->nObjs) {
      pGStack_20 = Gia_ManObj(p,local_24);
      bVar1 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar1) break;
    Vec_IntPush(p_00,pGStack_20->Value);
    local_24 = local_24 + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManSaveValue( Gia_Man_t * p )
{
    Vec_Int_t * vValues;
    Gia_Obj_t * pObj;
    int i;
    vValues = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
        Vec_IntPush( vValues, pObj->Value );
    return vValues;
}